

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O3

void * Ver_FormulaReduction(char *pFormula,void *pMan,Vec_Ptr_t *vNames,char *pErrorMessage)

{
  char cVar1;
  char cVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  void *pvVar5;
  char cVar6;
  char *pString;
  
  cVar1 = *pFormula;
  if (cVar1 == '~') {
    pString = pFormula + 2;
    cVar6 = pFormula[1];
  }
  else {
    pString = pFormula + 1;
    cVar6 = cVar1;
  }
  if (((cVar6 == '&') || (cVar6 == '|')) || (cVar6 == '^')) {
    do {
      cVar2 = *pString;
      pString = pString + 1;
    } while (cVar2 != '{');
    vNames->nSize = 0;
    iVar3 = 0;
    if (*pString != '}') {
      do {
        iVar3 = Ver_FormulaParserFindVar(pString,vNames);
        if (iVar3 < 0) {
LAB_0035734a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (vNames->nSize <= iVar3 * 2) goto LAB_0035734a;
        pString = pString + *(int *)(vNames->pArray + (uint)(iVar3 * 2));
        while( true ) {
          cVar2 = *pString;
          if ((cVar2 != ' ') && (cVar2 != ',')) break;
          pString = pString + 1;
        }
      } while (cVar2 != '}');
      iVar3 = vNames->nSize / 2;
    }
    if (cVar6 == '|') {
      pHVar4 = Hop_CreateOr((Hop_Man_t *)pMan,iVar3);
    }
    else if (cVar6 == '^') {
      pHVar4 = Hop_CreateExor((Hop_Man_t *)pMan,iVar3);
    }
    else if (cVar6 == '&') {
      pHVar4 = Hop_CreateAnd((Hop_Man_t *)pMan,iVar3);
    }
    else {
      pHVar4 = (Hop_Obj_t *)0x0;
    }
    pvVar5 = (void *)((ulong)(cVar1 == '~') ^ (ulong)pHVar4);
  }
  else {
    pvVar5 = (void *)0x0;
    sprintf(pErrorMessage,"Ver_FormulaReduction(): Unknown operation (%c)\n",(ulong)(uint)(int)cVar6
           );
  }
  return pvVar5;
}

Assistant:

void * Ver_FormulaReduction( char * pFormula, void * pMan, Vec_Ptr_t * vNames, char * pErrorMessage )
{
    Hop_Obj_t * pRes = NULL;
    int v, fCompl;
    char Symbol;

    // get the operation
    Symbol = *pFormula++;
    fCompl = ( Symbol == '~' );
    if ( fCompl )
        Symbol = *pFormula++;
    // check the operation
    if ( Symbol != '&' && Symbol != '|' && Symbol != '^' )
    {
        sprintf( pErrorMessage, "Ver_FormulaReduction(): Unknown operation (%c)\n", Symbol );
        return NULL;
    }
    // skip the brace
    while ( *pFormula++ != '{' );
    // parse the names
    Vec_PtrClear( vNames );
    while ( *pFormula != '}' )
    {
        v = Ver_FormulaParserFindVar( pFormula, vNames );
        pFormula += (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*v );
        while ( *pFormula == ' ' || *pFormula == ',' )
            pFormula++;
    }
    // compute the function
    if ( Symbol == '&' )
        pRes = Hop_CreateAnd( (Hop_Man_t *)pMan, Vec_PtrSize(vNames)/2 );
    else if ( Symbol == '|' )
        pRes = Hop_CreateOr( (Hop_Man_t *)pMan, Vec_PtrSize(vNames)/2 );
    else if ( Symbol == '^' )
        pRes = Hop_CreateExor( (Hop_Man_t *)pMan, Vec_PtrSize(vNames)/2 );
    return Hop_NotCond( pRes, fCompl );
}